

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGaussIntegrationRule.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChGaussIntegrationRule::SetIntOnCube
          (ChGaussIntegrationRule *this,int nPoints,
          vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
          *GpVector)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ChGaussPoint *pCVar4;
  ChLog *this_00;
  ChStreamOutAscii *this_01;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ChVector<double> coord;
  vector<double,_std::allocator<double>_> w;
  vector<double,_std::allocator<double>_> c;
  
  coord.m_data[2] = 0.0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  coord.m_data[0] = 0.0;
  coord.m_data[1] = 0.0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  std::vector<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>::resize
            (GpVector,(long)nPoints);
  if (nPoints == 1) {
    coord.m_data[2] = 0.0;
    coord.m_data[0] = 0.0;
    coord.m_data[1] = 0.0;
    pCVar4 = (ChGaussPoint *)::operator_new(0xa0);
    ChGaussPoint::ChGaussPoint(pCVar4,1,&coord,8.0);
    *(GpVector->
     super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>).
     _M_impl.super__Vector_impl_data._M_start = pCVar4;
  }
  else if (nPoints == 8) {
    std::vector<double,_std::allocator<double>_>::resize(&c,2);
    std::vector<double,_std::allocator<double>_>::resize(&w,2);
    *c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = -0.577350269189626;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = 0.577350269189626;
    *w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = 1.0;
    w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = 1.0;
    iVar7 = 1;
    lVar10 = 0;
    for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
      lVar9 = lVar10;
      iVar8 = iVar7;
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
          coord.m_data[0] =
               c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar6];
          coord.m_data[1] =
               c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar11];
          coord.m_data[2] =
               c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar5];
          dVar1 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
          dVar2 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11];
          dVar3 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5];
          pCVar4 = (ChGaussPoint *)::operator_new(0xa0);
          ChGaussPoint::ChGaussPoint(pCVar4,iVar8 + (int)lVar5,&coord,dVar2 * dVar1 * dVar3);
          *(ChGaussPoint **)
           ((long)(GpVector->
                  super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar5 * 8 + lVar9) = pCVar4;
        }
        iVar8 = iVar8 + 2;
        lVar9 = lVar9 + 0x10;
      }
      iVar7 = iVar7 + 4;
      lVar10 = lVar10 + 0x20;
    }
  }
  else if (nPoints == 0x1b) {
    std::vector<double,_std::allocator<double>_>::resize(&c,3);
    std::vector<double,_std::allocator<double>_>::resize(&w,3);
    *c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = -0.774596669241483;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = 0.0;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [2] = 0.774596669241483;
    *w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = 0.555555555555555;
    w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = 0.888888888888888;
    w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [2] = 0.555555555555555;
    iVar7 = 1;
    lVar10 = 0;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      lVar9 = lVar10;
      iVar8 = iVar7;
      for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
        for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
          coord.m_data[0] =
               c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar6];
          coord.m_data[1] =
               c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar11];
          coord.m_data[2] =
               c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar5];
          dVar1 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
          dVar2 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11];
          dVar3 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5];
          pCVar4 = (ChGaussPoint *)::operator_new(0xa0);
          ChGaussPoint::ChGaussPoint(pCVar4,iVar8 + (int)lVar5,&coord,dVar2 * dVar1 * dVar3);
          *(ChGaussPoint **)
           ((long)(GpVector->
                  super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar5 * 8 + lVar9) = pCVar4;
        }
        iVar8 = iVar8 + 3;
        lVar9 = lVar9 + 0x18;
      }
      iVar7 = iVar7 + 9;
      lVar10 = lVar10 + 0x48;
    }
  }
  else if (nPoints == 0x40) {
    std::vector<double,_std::allocator<double>_>::resize(&c,4);
    std::vector<double,_std::allocator<double>_>::resize(&w,4);
    *c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = -0.861136311594053;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = -0.339981043584856;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [2] = 0.339981043584856;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [3] = 0.861136311594053;
    *w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = 0.347854845137454;
    w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = 0.652145154862546;
    w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [2] = 0.652145154862546;
    w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [3] = 0.347854845137454;
    iVar7 = 1;
    lVar10 = 0;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      lVar9 = lVar10;
      iVar8 = iVar7;
      for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
        for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
          coord.m_data[0] =
               c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar6];
          coord.m_data[1] =
               c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar11];
          coord.m_data[2] =
               c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
               ._M_start[lVar5];
          dVar1 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
          dVar2 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11];
          dVar3 = w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar5];
          pCVar4 = (ChGaussPoint *)::operator_new(0xa0);
          ChGaussPoint::ChGaussPoint(pCVar4,iVar8 + (int)lVar5,&coord,dVar2 * dVar1 * dVar3);
          *(ChGaussPoint **)
           ((long)(GpVector->
                  super__Vector_base<chrono::fea::ChGaussPoint_*,_std::allocator<chrono::fea::ChGaussPoint_*>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar5 * 8 + lVar9) = pCVar4;
        }
        iVar8 = iVar8 + 4;
        lVar9 = lVar9 + 0x20;
      }
      iVar7 = iVar7 + 0x10;
      lVar10 = lVar10 + 0x80;
    }
  }
  else {
    this_00 = GetLog();
    this_01 = ChStreamOutAscii::operator<<
                        (&this_00->super_ChStreamOutAscii,
                         "SetIntOnCube: unsupported number of integration points: ");
    ChStreamOutAscii::operator<<(this_01,nPoints);
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&w.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&c.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void ChGaussIntegrationRule::SetIntOnCube(int nPoints, std::vector<ChGaussPoint*>* GpVector) {
    int i, j, k;
    double weight;
    ChVector<> coord;
    std::vector<double> c, w;

    // Resize the vector containing Gauss Points
    // GpVector = new std::vector<ChGaussPoint> [ nPoints ];
    (*GpVector).resize(nPoints);

    switch (nPoints) {
        case 1:

            coord.x() = 0.0;
            coord.y() = 0.0;
            coord.z() = 0.0;
            weight = 8.0;
            (*GpVector)[0] = new ChGaussPoint(1, &coord, weight);
            break;

        case 8:

            c.resize(2);
            w.resize(2);
            c[0] = -0.577350269189626;
            c[1] = 0.577350269189626;

            w[0] = 1.0;
            w[1] = 1.0;

            for (i = 0; i < 2; i++) {
                for (j = 0; j < 2; j++) {
                    for (k = 0; k < 2; k++) {
                        coord.x() = c[i];
                        coord.y() = c[j];
                        coord.z() = c[k];
                        weight = w[i] * w[j] * w[k];
                        // ChGaussPoint* my_gp = new ChGaussPoint( 4 *i + 2 *j + k , &coord, weight);
                        (*GpVector)[4 * i + 2 * j + k] = new ChGaussPoint(4 * i + 2 * j + k + 1, &coord, weight);
                    }
                }
            }

            break;

        case 27:

            c.resize(3);
            w.resize(3);
            c[0] = -0.774596669241483;
            c[1] = 0.0;
            c[2] = 0.774596669241483;

            w[0] = 0.555555555555555;
            w[1] = 0.888888888888888;
            w[2] = 0.555555555555555;

            for (i = 0; i < 3; i++) {
                for (j = 0; j < 3; j++) {
                    for (k = 0; k < 3; k++) {
                        coord.x() = c[i];
                        coord.y() = c[j];
                        coord.z() = c[k];
                        weight = w[i] * w[j] * w[k];
                        (*GpVector)[9 * i + 3 * j + k] = new ChGaussPoint(9 * i + 3 * j + k + 1, &coord, weight);
                    }
                }
            }

            break;

        case 64:

            c.resize(4);
            w.resize(4);
            c[0] = -0.861136311594053;
            c[1] = -0.339981043584856;
            c[2] = 0.339981043584856;
            c[3] = 0.861136311594053;

            w[0] = 0.347854845137454;
            w[1] = 0.652145154862546;
            w[2] = 0.652145154862546;
            w[3] = 0.347854845137454;

            for (i = 0; i < 4; i++) {
                for (j = 0; j < 4; j++) {
                    for (k = 0; k < 4; k++) {
                        coord.x() = c[i];
                        coord.y() = c[j];
                        coord.z() = c[k];
                        weight = w[i] * w[j] * w[k];
                        (*GpVector)[16 * i + 4 * j + k] = new ChGaussPoint(16 * i + 4 * j + k + 1, &coord, weight);
                    }
                }
            }

            break;

        default:
            GetLog() << "SetIntOnCube: unsupported number of integration points: " << nPoints;

    }  //__end of Switch
}